

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffhdef(fitsfile *fptr,int morekeys,int *status)

{
  long lVar1;
  long lVar2;
  int *in_RDX;
  int in_ESI;
  int *in_RDI;
  LONGLONG delta;
  int *in_stack_00000040;
  int *in_stack_00000048;
  int in_stack_00000054;
  fitsfile *in_stack_00000058;
  int *in_stack_000000e0;
  fitsfile *in_stack_000000e8;
  int local_4;
  
  if ((*in_RDX < 1) && (0 < in_ESI)) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if (*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) {
        ffrdef(in_stack_000000e8,in_stack_000000e0);
        lVar1 = ((*(long *)(*(long *)(in_RDI + 2) + 0x70) + (long)(in_ESI * 0x50)) / 0xb40 + 1) *
                0xb40 - *(long *)(*(long *)(in_RDI + 2) + 0x88);
        *(long *)(*(long *)(in_RDI + 2) + 0x88) = lVar1 + *(long *)(*(long *)(in_RDI + 2) + 0x88);
        lVar2 = (long)(*(int *)(*(long *)(in_RDI + 2) + 0x54) + 1);
        *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + lVar2 * 8) =
             lVar1 + *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + lVar2 * 8);
      }
    }
    else {
      ffmahd(in_stack_00000058,in_stack_00000054,in_stack_00000048,in_stack_00000040);
    }
    local_4 = *in_RDX;
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffhdef(fitsfile *fptr,      /* I - FITS file pointer                    */
           int morekeys,        /* I - reserve space for this many keywords */
           int *status)         /* IO - error status                        */
/*
  based on the number of keywords which have already been written,
  plus the number of keywords to reserve space for, we then can
  define where the data unit should start (it must start at the
  beginning of a 2880-byte logical block).

  This routine will only have any effect if the starting location of the
  data unit following the header is not already defined.  In any case,
  it is always possible to add more keywords to the header even if the
  data has already been written.  It is just more efficient to reserve
  the space in advance.
*/
{
    LONGLONG delta;

    if (*status > 0 || morekeys < 1)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
      ffrdef(fptr, status);

      /* ffrdef defines the offset to datastart and the start of */
      /* the next HDU based on the number of existing keywords. */
      /* We need to increment both of these values based on */
      /* the number of new keywords to be added.  */

      delta = (((fptr->Fptr)->headend + (morekeys * 80)) / 2880 + 1)
                                * 2880 - (fptr->Fptr)->datastart; 
              
      (fptr->Fptr)->datastart += delta;

      (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] += delta;

    }
    return(*status);
}